

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdfrend.c
# Opt level: O0

FT_Error ft_sdf_init(FT_Renderer_conflict render)

{
  SDF_Renderer sdf_render;
  FT_Renderer_conflict render_local;
  
  *(undefined4 *)&render[1].root.clazz = 8;
  *(undefined1 *)((long)&render[1].root.clazz + 4) = 0;
  *(undefined1 *)((long)&render[1].root.clazz + 5) = 0;
  *(undefined1 *)((long)&render[1].root.clazz + 6) = 0;
  return 0;
}

Assistant:

static FT_Error
  ft_sdf_init( FT_Renderer  render )
  {
    SDF_Renderer  sdf_render = SDF_RENDERER( render );


    sdf_render->spread    = DEFAULT_SPREAD;
    sdf_render->flip_sign = 0;
    sdf_render->flip_y    = 0;
    sdf_render->overlaps  = 0;

    return FT_Err_Ok;
  }